

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BlendFuncTestCase::SetBlendFunc
          (BlendFuncTestCase *this,GLenum func)

{
  switch(this->m_testTargetName) {
  case 0x80c8:
  case 0x80ca:
    glu::CallLogWrapper::glBlendFunc(&(this->super_ApiCase).super_CallLogWrapper,0,func);
    return;
  case 0x80c9:
  case 0x80cb:
    glu::CallLogWrapper::glBlendFunc(&(this->super_ApiCase).super_CallLogWrapper,func,0);
    return;
  default:
    return;
  }
}

Assistant:

virtual void SetBlendFunc (GLenum func)
	{
		switch (m_testTargetName)
		{
		case GL_BLEND_SRC_RGB:
		case GL_BLEND_SRC_ALPHA:
			glBlendFunc(func, GL_ZERO);
			break;

		case GL_BLEND_DST_RGB:
		case GL_BLEND_DST_ALPHA:
			glBlendFunc(GL_ZERO, func);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}